

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *this;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  FieldDescriptor *field;
  ExtensionRange *pEVar5;
  Reflection *extraout_RDX;
  uint res;
  byte *pbVar6;
  uint key;
  char cVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  MessageSetParser message_set;
  byte *local_c8;
  Reflection *local_c0;
  MessageSetParser local_b8;
  LogMessage local_a0;
  LogMessage local_68;
  Descriptor *this_00;
  
  local_c8 = (byte *)ptr;
  iVar3 = (*(msg->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = (Descriptor *)CONCAT44(extraout_var,iVar3);
  (*(msg->super_MessageLite)._vptr_MessageLite[0x11])(msg);
  local_c0 = extraout_RDX;
  if (this_00 == (Descriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30e);
    pLVar4 = LogMessage::operator<<(&local_68,"CHECK failed: descriptor: ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  if (local_c0 == (Reflection *)0x0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30f);
    pLVar4 = LogMessage::operator<<(&local_a0,"CHECK failed: reflection: ");
    LogFinisher::operator=((LogFinisher *)&local_b8,pLVar4);
    LogMessage::~LogMessage(&local_a0);
  }
  if (*(char *)(*(long *)(this_00 + 0x20) + 0x48) == '\0') {
    do {
      bVar2 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_c8,ctx->group_depth_);
      if (bVar2) {
        return (char *)local_c8;
      }
      bVar1 = *local_c8;
      res = (uint)bVar1;
      pbVar6 = local_c8 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
        if ((char)*pbVar6 < '\0') {
          pVar8 = ReadTagFallback((char *)local_c8,res);
          pbVar6 = (byte *)pVar8.first;
          res = pVar8.second;
        }
        else {
          pbVar6 = local_c8 + 2;
        }
      }
      local_c8 = pbVar6;
      if (pbVar6 == (byte *)0x0) {
        cVar7 = '\x01';
      }
      else if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar7 = '\x03';
      }
      else {
        key = res >> 3;
        field = Descriptor::FindFieldByNumber(this_00,key);
        if (field == (FieldDescriptor *)0x0) {
          pEVar5 = Descriptor::FindExtensionRangeContainingNumber(this_00,key);
          if (pEVar5 == (ExtensionRange *)0x0) {
            field = (FieldDescriptor *)0x0;
          }
          else {
            this = (ctx->data_).pool;
            if (this == (DescriptorPool *)0x0) {
              field = Reflection::FindKnownExtensionByNumber(local_c0,key);
            }
            else {
              field = DescriptorPool::FindExtensionByNumber(this,this_00,key);
            }
          }
        }
        local_c8 = (byte *)_InternalParseAndMergeField
                                     (msg,(char *)local_c8,ctx,(ulong)res,local_c0,field);
        cVar7 = local_c8 == (byte *)0x0;
      }
    } while (cVar7 == '\0');
    if (cVar7 != '\x03') {
      local_c8 = (byte *)0x0;
    }
  }
  else {
    local_b8.reflection = local_c0;
    local_b8.msg = msg;
    local_b8.descriptor = this_00;
    local_c8 = (byte *)MessageSetParser::ParseMessageSet(&local_b8,(char *)local_c8,ctx);
  }
  return (char *)local_c8;
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  GOOGLE_DCHECK(descriptor);
  GOOGLE_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}